

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum256_32.c
# Opt level: O3

void exp_consttime_precomp
               (uint64_t *n,uint64_t mu,uint64_t *r2,uint64_t *a,uint32_t bBits,uint64_t *b,
               uint64_t *res)

{
  uint uVar1;
  long lVar2;
  uint64_t uVar3;
  ulong uVar4;
  byte bVar5;
  sbyte sVar6;
  uint uVar7;
  ulong uVar8;
  uint64_t *c_00;
  uint uVar9;
  uint uVar10;
  int iVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  uint64_t *ctx_r2;
  uint64_t resM [64];
  uint64_t tmp0 [64];
  uint64_t aM [64];
  uint64_t c_2 [128];
  uint64_t aM_1 [64];
  uint64_t c [128];
  uint64_t table [1024];
  uint64_t tmp [64];
  uint64_t local_3838 [64];
  uint64_t local_3638 [64];
  uint64_t local_3438 [64];
  uint64_t local_3238 [64];
  undefined1 auStack_3038 [512];
  uint64_t local_2e38 [64];
  undefined1 local_2c38 [512];
  uint64_t local_2a38 [64];
  undefined1 local_2838 [1536];
  uint64_t local_2238 [64];
  uint64_t local_2038 [64];
  uint64_t local_1e38 [64];
  uint64_t local_1c38 [64];
  uint64_t local_1a38 [64];
  uint64_t local_1838 [64];
  uint64_t local_1638 [64];
  uint64_t local_1438 [64];
  uint64_t local_1238 [64];
  undefined1 local_1038 [512];
  uint64_t local_e38 [64];
  undefined1 local_c38 [512];
  uint64_t local_a38 [64];
  undefined1 local_838 [512];
  uint64_t local_638 [64];
  undefined1 local_438 [512];
  uint64_t local_238 [65];
  
  if (bBits < 200) {
    uVar10 = 0;
    memset(local_2e38,0,0x200);
    memset(local_2a38,0,0x400);
    memset(local_2238,0,0x800);
    Hacl_Bignum_Karatsuba_bn_karatsuba_mul_uint64(0x40,a,r2,local_2238,local_2a38);
    reduction(n,mu,local_2a38,local_2e38);
    memset(local_3438,0,0x200);
    memcpy(local_3238,n,0x200);
    memcpy(auStack_3038,r2,0x200);
    memset(local_2038,0,0x200);
    memcpy(local_2238,r2,0x200);
    reduction(local_3238,mu,local_2238,local_3438);
    uVar8 = 0;
    uVar4 = uVar8;
    if (bBits != 0) {
      do {
        uVar8 = (ulong)((b[~uVar10 + bBits >> 6] >> ((ulong)(~uVar10 + bBits) & 0x3f) & 1) != 0);
        lVar2 = -(uVar4 ^ uVar8);
        auVar12._8_4_ = (int)lVar2;
        auVar12._0_8_ = lVar2;
        auVar12._12_4_ = (int)((ulong)lVar2 >> 0x20);
        lVar2 = 0;
        do {
          auVar73 = (*(undefined1 (*) [16])(local_2e38 + lVar2) ^
                    *(undefined1 (*) [16])(local_3438 + lVar2)) & auVar12;
          *(undefined1 (*) [16])(local_3438 + lVar2) =
               *(undefined1 (*) [16])(local_3438 + lVar2) ^ auVar73;
          *(undefined1 (*) [16])(local_2e38 + lVar2) =
               auVar73 ^ *(undefined1 (*) [16])(local_2e38 + lVar2);
          lVar2 = lVar2 + 2;
        } while (lVar2 != 0x40);
        memset(local_2a38,0,0x400);
        memset(local_2238,0,0x800);
        Hacl_Bignum_Karatsuba_bn_karatsuba_mul_uint64
                  (0x40,local_2e38,local_3438,local_2238,local_2a38);
        areduction(local_3238,mu,local_2a38,local_2e38);
        memset(local_2a38,0,0x400);
        memset(local_2238,0,0x800);
        Hacl_Bignum_Karatsuba_bn_karatsuba_sqr_uint64(0x40,local_3438,local_2238,local_2a38);
        areduction(local_3238,mu,local_2a38,local_3438);
        uVar10 = uVar10 + 1;
        uVar4 = uVar8;
      } while (uVar10 != bBits);
    }
    lVar2 = -uVar8;
    auVar13._8_4_ = (int)lVar2;
    auVar13._0_8_ = lVar2;
    auVar13._12_4_ = (int)((ulong)lVar2 >> 0x20);
    lVar2 = 0;
    do {
      auVar73 = (*(undefined1 (*) [16])(local_2e38 + lVar2) ^
                *(undefined1 (*) [16])(local_3438 + lVar2)) & auVar13;
      *(undefined1 (*) [16])(local_3438 + lVar2) =
           *(undefined1 (*) [16])(local_3438 + lVar2) ^ auVar73;
      *(undefined1 (*) [16])(local_2e38 + lVar2) =
           auVar73 ^ *(undefined1 (*) [16])(local_2e38 + lVar2);
      lVar2 = lVar2 + 2;
    } while (lVar2 != 0x40);
    memset(local_2038,0,0x200);
    c_00 = local_2238;
    memcpy(c_00,local_3438,0x200);
  }
  else {
    memset(local_3438,0,0x200);
    memset(local_2a38,0,0x400);
    memset(local_2238,0,0x800);
    Hacl_Bignum_Karatsuba_bn_karatsuba_mul_uint64(0x40,a,r2,local_2238,local_2a38);
    reduction(n,mu,local_2a38,local_3438);
    memset(local_3838,0,0x200);
    uVar10 = bBits - 1 >> 6;
    memcpy(local_2e38,n,0x200);
    memcpy(local_2c38,r2,0x200);
    memset(local_2238,0,0x2000);
    memset(local_238,0,0x200);
    memset(local_2838,0,0x200);
    memcpy(local_2a38,r2,0x200);
    reduction(local_2e38,mu,local_2a38,local_2238);
    memcpy(local_2038,local_3438,0x200);
    memset(local_3238,0,0x400);
    memset(local_2a38,0,0x800);
    Hacl_Bignum_Karatsuba_bn_karatsuba_sqr_uint64(0x40,local_2038,local_2a38,local_3238);
    areduction(local_2e38,mu,local_3238,local_238);
    memcpy(local_1e38,local_238,0x200);
    memset(local_3238,0,0x400);
    memset(local_2a38,0,0x800);
    Hacl_Bignum_Karatsuba_bn_karatsuba_mul_uint64(0x40,local_3438,local_1e38,local_2a38,local_3238);
    areduction(local_2e38,mu,local_3238,local_238);
    memcpy(local_1c38,local_238,0x200);
    memset(local_3238,0,0x400);
    memset(local_2a38,0,0x800);
    Hacl_Bignum_Karatsuba_bn_karatsuba_sqr_uint64(0x40,local_1e38,local_2a38,local_3238);
    areduction(local_2e38,mu,local_3238,local_238);
    memcpy(local_1a38,local_238,0x200);
    memset(local_3238,0,0x400);
    memset(local_2a38,0,0x800);
    Hacl_Bignum_Karatsuba_bn_karatsuba_mul_uint64(0x40,local_3438,local_1a38,local_2a38,local_3238);
    areduction(local_2e38,mu,local_3238,local_238);
    memcpy(local_1838,local_238,0x200);
    memset(local_3238,0,0x400);
    memset(local_2a38,0,0x800);
    Hacl_Bignum_Karatsuba_bn_karatsuba_sqr_uint64(0x40,local_1c38,local_2a38,local_3238);
    areduction(local_2e38,mu,local_3238,local_238);
    memcpy(local_1638,local_238,0x200);
    memset(local_3238,0,0x400);
    memset(local_2a38,0,0x800);
    Hacl_Bignum_Karatsuba_bn_karatsuba_mul_uint64(0x40,local_3438,local_1638,local_2a38,local_3238);
    areduction(local_2e38,mu,local_3238,local_238);
    memcpy(local_1438,local_238,0x200);
    memset(local_3238,0,0x400);
    memset(local_2a38,0,0x800);
    Hacl_Bignum_Karatsuba_bn_karatsuba_sqr_uint64(0x40,local_1a38,local_2a38,local_3238);
    areduction(local_2e38,mu,local_3238,local_238);
    memcpy(local_1238,local_238,0x200);
    memset(local_3238,0,0x400);
    memset(local_2a38,0,0x800);
    Hacl_Bignum_Karatsuba_bn_karatsuba_mul_uint64(0x40,local_3438,local_1238,local_2a38,local_3238);
    areduction(local_2e38,mu,local_3238,local_238);
    memcpy(local_1038,local_238,0x200);
    memset(local_3238,0,0x400);
    memset(local_2a38,0,0x800);
    Hacl_Bignum_Karatsuba_bn_karatsuba_sqr_uint64(0x40,local_1838,local_2a38,local_3238);
    areduction(local_2e38,mu,local_3238,local_238);
    memcpy(local_e38,local_238,0x200);
    memset(local_3238,0,0x400);
    memset(local_2a38,0,0x800);
    Hacl_Bignum_Karatsuba_bn_karatsuba_mul_uint64(0x40,local_3438,local_e38,local_2a38,local_3238);
    areduction(local_2e38,mu,local_3238,local_238);
    memcpy(local_c38,local_238,0x200);
    memset(local_3238,0,0x400);
    memset(local_2a38,0,0x800);
    Hacl_Bignum_Karatsuba_bn_karatsuba_sqr_uint64(0x40,local_1638,local_2a38,local_3238);
    areduction(local_2e38,mu,local_3238,local_238);
    memcpy(local_a38,local_238,0x200);
    memset(local_3238,0,0x400);
    memset(local_2a38,0,0x800);
    Hacl_Bignum_Karatsuba_bn_karatsuba_mul_uint64(0x40,local_3438,local_a38,local_2a38,local_3238);
    areduction(local_2e38,mu,local_3238,local_238);
    memcpy(local_838,local_238,0x200);
    memset(local_3238,0,0x400);
    memset(local_2a38,0,0x800);
    Hacl_Bignum_Karatsuba_bn_karatsuba_sqr_uint64(0x40,local_1438,local_2a38,local_3238);
    areduction(local_2e38,mu,local_3238,local_238);
    memcpy(local_638,local_238,0x200);
    memset(local_3238,0,0x400);
    memset(local_2a38,0,0x800);
    Hacl_Bignum_Karatsuba_bn_karatsuba_mul_uint64(0x40,local_3438,local_638,local_2a38,local_3238);
    areduction(local_2e38,mu,local_3238,local_238);
    memcpy(local_438,local_238,0x200);
    if ((bBits & 3) == 0) {
      memset(local_2838,0,0x200);
      memcpy(local_2a38,local_2c38,0x200);
      reduction(local_2e38,mu,local_2a38,local_3838);
    }
    else {
      uVar1 = bBits >> 6;
      bVar5 = (byte)bBits & 0x3c;
      uVar7 = (uint)(b[uVar1] >> bVar5);
      if ((bBits & 0x3c) != 0 && uVar1 < uVar10) {
        uVar7 = uVar7 | (uint)(b[(ulong)uVar1 + 1] << (-bVar5 & 0x3f));
      }
      uVar8 = (ulong)(uVar7 & 0xf);
      memcpy(local_3838,local_2238,0x200);
      uVar3 = FStar_UInt64_eq_mask(uVar8,1);
      uVar4 = ~uVar3;
      auVar73._8_4_ = (int)uVar3;
      auVar73._0_8_ = uVar3;
      auVar73._12_4_ = (int)(uVar3 >> 0x20);
      auVar43._8_4_ = (int)uVar4;
      auVar43._0_8_ = uVar4;
      auVar43._12_4_ = (int)(uVar4 >> 0x20);
      lVar2 = 0;
      do {
        *(undefined1 (*) [16])(local_3838 + lVar2) =
             *(undefined1 (*) [16])(local_3838 + lVar2) & auVar43 |
             *(undefined1 (*) [16])(local_2038 + lVar2) & auVar73;
        lVar2 = lVar2 + 2;
      } while (lVar2 != 0x40);
      uVar3 = FStar_UInt64_eq_mask(uVar8,2);
      uVar4 = ~uVar3;
      auVar14._8_4_ = (int)uVar3;
      auVar14._0_8_ = uVar3;
      auVar14._12_4_ = (int)(uVar3 >> 0x20);
      auVar44._8_4_ = (int)uVar4;
      auVar44._0_8_ = uVar4;
      auVar44._12_4_ = (int)(uVar4 >> 0x20);
      lVar2 = 0;
      do {
        *(undefined1 (*) [16])(local_3838 + lVar2) =
             *(undefined1 (*) [16])(local_3838 + lVar2) & auVar44 |
             *(undefined1 (*) [16])(local_1e38 + lVar2) & auVar14;
        lVar2 = lVar2 + 2;
      } while (lVar2 != 0x40);
      uVar3 = FStar_UInt64_eq_mask(uVar8,3);
      uVar4 = ~uVar3;
      auVar15._8_4_ = (int)uVar3;
      auVar15._0_8_ = uVar3;
      auVar15._12_4_ = (int)(uVar3 >> 0x20);
      auVar45._8_4_ = (int)uVar4;
      auVar45._0_8_ = uVar4;
      auVar45._12_4_ = (int)(uVar4 >> 0x20);
      lVar2 = 0;
      do {
        *(undefined1 (*) [16])(local_3838 + lVar2) =
             *(undefined1 (*) [16])(local_3838 + lVar2) & auVar45 |
             *(undefined1 (*) [16])(local_1c38 + lVar2) & auVar15;
        lVar2 = lVar2 + 2;
      } while (lVar2 != 0x40);
      uVar3 = FStar_UInt64_eq_mask(uVar8,4);
      uVar4 = ~uVar3;
      auVar16._8_4_ = (int)uVar3;
      auVar16._0_8_ = uVar3;
      auVar16._12_4_ = (int)(uVar3 >> 0x20);
      auVar46._8_4_ = (int)uVar4;
      auVar46._0_8_ = uVar4;
      auVar46._12_4_ = (int)(uVar4 >> 0x20);
      lVar2 = 0;
      do {
        *(undefined1 (*) [16])(local_3838 + lVar2) =
             *(undefined1 (*) [16])(local_3838 + lVar2) & auVar46 |
             *(undefined1 (*) [16])(local_1a38 + lVar2) & auVar16;
        lVar2 = lVar2 + 2;
      } while (lVar2 != 0x40);
      uVar3 = FStar_UInt64_eq_mask(uVar8,5);
      uVar4 = ~uVar3;
      auVar17._8_4_ = (int)uVar3;
      auVar17._0_8_ = uVar3;
      auVar17._12_4_ = (int)(uVar3 >> 0x20);
      auVar47._8_4_ = (int)uVar4;
      auVar47._0_8_ = uVar4;
      auVar47._12_4_ = (int)(uVar4 >> 0x20);
      lVar2 = 0;
      do {
        *(undefined1 (*) [16])(local_3838 + lVar2) =
             *(undefined1 (*) [16])(local_3838 + lVar2) & auVar47 |
             *(undefined1 (*) [16])(local_1838 + lVar2) & auVar17;
        lVar2 = lVar2 + 2;
      } while (lVar2 != 0x40);
      uVar3 = FStar_UInt64_eq_mask(uVar8,6);
      uVar4 = ~uVar3;
      auVar18._8_4_ = (int)uVar3;
      auVar18._0_8_ = uVar3;
      auVar18._12_4_ = (int)(uVar3 >> 0x20);
      auVar48._8_4_ = (int)uVar4;
      auVar48._0_8_ = uVar4;
      auVar48._12_4_ = (int)(uVar4 >> 0x20);
      lVar2 = 0;
      do {
        *(undefined1 (*) [16])(local_3838 + lVar2) =
             *(undefined1 (*) [16])(local_3838 + lVar2) & auVar48 |
             *(undefined1 (*) [16])(local_1638 + lVar2) & auVar18;
        lVar2 = lVar2 + 2;
      } while (lVar2 != 0x40);
      uVar3 = FStar_UInt64_eq_mask(uVar8,7);
      uVar4 = ~uVar3;
      auVar19._8_4_ = (int)uVar3;
      auVar19._0_8_ = uVar3;
      auVar19._12_4_ = (int)(uVar3 >> 0x20);
      auVar49._8_4_ = (int)uVar4;
      auVar49._0_8_ = uVar4;
      auVar49._12_4_ = (int)(uVar4 >> 0x20);
      lVar2 = 0;
      do {
        *(undefined1 (*) [16])(local_3838 + lVar2) =
             *(undefined1 (*) [16])(local_3838 + lVar2) & auVar49 |
             *(undefined1 (*) [16])(local_1438 + lVar2) & auVar19;
        lVar2 = lVar2 + 2;
      } while (lVar2 != 0x40);
      uVar3 = FStar_UInt64_eq_mask(uVar8,8);
      uVar4 = ~uVar3;
      auVar20._8_4_ = (int)uVar3;
      auVar20._0_8_ = uVar3;
      auVar20._12_4_ = (int)(uVar3 >> 0x20);
      auVar50._8_4_ = (int)uVar4;
      auVar50._0_8_ = uVar4;
      auVar50._12_4_ = (int)(uVar4 >> 0x20);
      lVar2 = 0;
      do {
        *(undefined1 (*) [16])(local_3838 + lVar2) =
             *(undefined1 (*) [16])(local_3838 + lVar2) & auVar50 |
             *(undefined1 (*) [16])(local_1238 + lVar2) & auVar20;
        lVar2 = lVar2 + 2;
      } while (lVar2 != 0x40);
      uVar3 = FStar_UInt64_eq_mask(uVar8,9);
      uVar4 = ~uVar3;
      auVar21._8_4_ = (int)uVar3;
      auVar21._0_8_ = uVar3;
      auVar21._12_4_ = (int)(uVar3 >> 0x20);
      auVar51._8_4_ = (int)uVar4;
      auVar51._0_8_ = uVar4;
      auVar51._12_4_ = (int)(uVar4 >> 0x20);
      lVar2 = 0;
      do {
        *(undefined1 (*) [16])(local_3838 + lVar2) =
             *(undefined1 (*) [16])(local_3838 + lVar2) & auVar51 |
             *(undefined1 (*) [16])(local_1038 + lVar2 * 8) & auVar21;
        lVar2 = lVar2 + 2;
      } while (lVar2 != 0x40);
      uVar3 = FStar_UInt64_eq_mask(uVar8,10);
      uVar4 = ~uVar3;
      auVar22._8_4_ = (int)uVar3;
      auVar22._0_8_ = uVar3;
      auVar22._12_4_ = (int)(uVar3 >> 0x20);
      auVar52._8_4_ = (int)uVar4;
      auVar52._0_8_ = uVar4;
      auVar52._12_4_ = (int)(uVar4 >> 0x20);
      lVar2 = 0;
      do {
        *(undefined1 (*) [16])(local_3838 + lVar2) =
             *(undefined1 (*) [16])(local_3838 + lVar2) & auVar52 |
             *(undefined1 (*) [16])(local_e38 + lVar2) & auVar22;
        lVar2 = lVar2 + 2;
      } while (lVar2 != 0x40);
      uVar3 = FStar_UInt64_eq_mask(uVar8,0xb);
      uVar4 = ~uVar3;
      auVar23._8_4_ = (int)uVar3;
      auVar23._0_8_ = uVar3;
      auVar23._12_4_ = (int)(uVar3 >> 0x20);
      auVar53._8_4_ = (int)uVar4;
      auVar53._0_8_ = uVar4;
      auVar53._12_4_ = (int)(uVar4 >> 0x20);
      lVar2 = 0;
      do {
        *(undefined1 (*) [16])(local_3838 + lVar2) =
             *(undefined1 (*) [16])(local_3838 + lVar2) & auVar53 |
             *(undefined1 (*) [16])(local_c38 + lVar2 * 8) & auVar23;
        lVar2 = lVar2 + 2;
      } while (lVar2 != 0x40);
      uVar3 = FStar_UInt64_eq_mask(uVar8,0xc);
      uVar4 = ~uVar3;
      auVar24._8_4_ = (int)uVar3;
      auVar24._0_8_ = uVar3;
      auVar24._12_4_ = (int)(uVar3 >> 0x20);
      auVar54._8_4_ = (int)uVar4;
      auVar54._0_8_ = uVar4;
      auVar54._12_4_ = (int)(uVar4 >> 0x20);
      lVar2 = 0;
      do {
        *(undefined1 (*) [16])(local_3838 + lVar2) =
             *(undefined1 (*) [16])(local_3838 + lVar2) & auVar54 |
             *(undefined1 (*) [16])(local_a38 + lVar2) & auVar24;
        lVar2 = lVar2 + 2;
      } while (lVar2 != 0x40);
      uVar3 = FStar_UInt64_eq_mask(uVar8,0xd);
      uVar4 = ~uVar3;
      auVar25._8_4_ = (int)uVar3;
      auVar25._0_8_ = uVar3;
      auVar25._12_4_ = (int)(uVar3 >> 0x20);
      auVar55._8_4_ = (int)uVar4;
      auVar55._0_8_ = uVar4;
      auVar55._12_4_ = (int)(uVar4 >> 0x20);
      lVar2 = 0;
      do {
        *(undefined1 (*) [16])(local_3838 + lVar2) =
             *(undefined1 (*) [16])(local_3838 + lVar2) & auVar55 |
             *(undefined1 (*) [16])(local_838 + lVar2 * 8) & auVar25;
        lVar2 = lVar2 + 2;
      } while (lVar2 != 0x40);
      uVar3 = FStar_UInt64_eq_mask(uVar8,0xe);
      uVar4 = ~uVar3;
      auVar26._8_4_ = (int)uVar3;
      auVar26._0_8_ = uVar3;
      auVar26._12_4_ = (int)(uVar3 >> 0x20);
      auVar56._8_4_ = (int)uVar4;
      auVar56._0_8_ = uVar4;
      auVar56._12_4_ = (int)(uVar4 >> 0x20);
      lVar2 = 0;
      do {
        *(undefined1 (*) [16])(local_3838 + lVar2) =
             *(undefined1 (*) [16])(local_3838 + lVar2) & auVar56 |
             *(undefined1 (*) [16])(local_638 + lVar2) & auVar26;
        lVar2 = lVar2 + 2;
      } while (lVar2 != 0x40);
      uVar3 = FStar_UInt64_eq_mask(uVar8,0xf);
      uVar4 = ~uVar3;
      auVar27._8_4_ = (int)uVar3;
      auVar27._0_8_ = uVar3;
      auVar27._12_4_ = (int)(uVar3 >> 0x20);
      auVar57._8_4_ = (int)uVar4;
      auVar57._0_8_ = uVar4;
      auVar57._12_4_ = (int)(uVar4 >> 0x20);
      lVar2 = 0;
      do {
        *(undefined1 (*) [16])(local_3838 + lVar2) =
             *(undefined1 (*) [16])(local_3838 + lVar2) & auVar57 |
             *(undefined1 (*) [16])(local_438 + lVar2 * 8) & auVar27;
        lVar2 = lVar2 + 2;
      } while (lVar2 != 0x40);
    }
    iVar11 = 0;
    memset(local_3638,0,0x200);
    do {
      memset(local_3238,0,0x400);
      memset(local_2a38,0,0x800);
      Hacl_Bignum_Karatsuba_bn_karatsuba_sqr_uint64(0x40,local_3838,local_2a38,local_3238);
      areduction(local_2e38,mu,local_3238,local_3838);
      memset(local_3238,0,0x400);
      memset(local_2a38,0,0x800);
      Hacl_Bignum_Karatsuba_bn_karatsuba_sqr_uint64(0x40,local_3838,local_2a38,local_3238);
      areduction(local_2e38,mu,local_3238,local_3838);
      memset(local_3238,0,0x400);
      memset(local_2a38,0,0x800);
      Hacl_Bignum_Karatsuba_bn_karatsuba_sqr_uint64(0x40,local_3838,local_2a38,local_3238);
      areduction(local_2e38,mu,local_3238,local_3838);
      memset(local_3238,0,0x400);
      memset(local_2a38,0,0x800);
      Hacl_Bignum_Karatsuba_bn_karatsuba_sqr_uint64(0x40,local_3838,local_2a38,local_3238);
      areduction(local_2e38,mu,local_3238,local_3838);
      uVar7 = ((bBits & 0xfffffffc) + iVar11 * -4) - 4;
      uVar1 = uVar7 >> 6;
      uVar7 = uVar7 & 0x3c;
      sVar6 = (sbyte)uVar7;
      uVar9 = (uint)(b[uVar1] >> sVar6);
      if (uVar7 != 0 && uVar1 < uVar10) {
        uVar9 = uVar9 | (uint)(b[(ulong)uVar1 + 1] << (-sVar6 & 0x3fU));
      }
      uVar8 = (ulong)(uVar9 & 0xf);
      memcpy(local_3638,local_2238,0x200);
      uVar3 = FStar_UInt64_eq_mask(uVar8,1);
      uVar4 = ~uVar3;
      auVar28._8_4_ = (int)uVar3;
      auVar28._0_8_ = uVar3;
      auVar28._12_4_ = (int)(uVar3 >> 0x20);
      auVar58._8_4_ = (int)uVar4;
      auVar58._0_8_ = uVar4;
      auVar58._12_4_ = (int)(uVar4 >> 0x20);
      lVar2 = 0;
      do {
        *(undefined1 (*) [16])(local_3638 + lVar2) =
             *(undefined1 (*) [16])(local_3638 + lVar2) & auVar58 |
             *(undefined1 (*) [16])(local_2038 + lVar2) & auVar28;
        lVar2 = lVar2 + 2;
      } while (lVar2 != 0x40);
      uVar3 = FStar_UInt64_eq_mask(uVar8,2);
      uVar4 = ~uVar3;
      auVar29._8_4_ = (int)uVar3;
      auVar29._0_8_ = uVar3;
      auVar29._12_4_ = (int)(uVar3 >> 0x20);
      auVar59._8_4_ = (int)uVar4;
      auVar59._0_8_ = uVar4;
      auVar59._12_4_ = (int)(uVar4 >> 0x20);
      lVar2 = 0;
      do {
        *(undefined1 (*) [16])(local_3638 + lVar2) =
             *(undefined1 (*) [16])(local_3638 + lVar2) & auVar59 |
             *(undefined1 (*) [16])(local_1e38 + lVar2) & auVar29;
        lVar2 = lVar2 + 2;
      } while (lVar2 != 0x40);
      uVar3 = FStar_UInt64_eq_mask(uVar8,3);
      uVar4 = ~uVar3;
      auVar30._8_4_ = (int)uVar3;
      auVar30._0_8_ = uVar3;
      auVar30._12_4_ = (int)(uVar3 >> 0x20);
      auVar60._8_4_ = (int)uVar4;
      auVar60._0_8_ = uVar4;
      auVar60._12_4_ = (int)(uVar4 >> 0x20);
      lVar2 = 0;
      do {
        *(undefined1 (*) [16])(local_3638 + lVar2) =
             *(undefined1 (*) [16])(local_3638 + lVar2) & auVar60 |
             *(undefined1 (*) [16])(local_1c38 + lVar2) & auVar30;
        lVar2 = lVar2 + 2;
      } while (lVar2 != 0x40);
      uVar3 = FStar_UInt64_eq_mask(uVar8,4);
      uVar4 = ~uVar3;
      auVar31._8_4_ = (int)uVar3;
      auVar31._0_8_ = uVar3;
      auVar31._12_4_ = (int)(uVar3 >> 0x20);
      auVar61._8_4_ = (int)uVar4;
      auVar61._0_8_ = uVar4;
      auVar61._12_4_ = (int)(uVar4 >> 0x20);
      lVar2 = 0;
      do {
        *(undefined1 (*) [16])(local_3638 + lVar2) =
             *(undefined1 (*) [16])(local_3638 + lVar2) & auVar61 |
             *(undefined1 (*) [16])(local_1a38 + lVar2) & auVar31;
        lVar2 = lVar2 + 2;
      } while (lVar2 != 0x40);
      uVar3 = FStar_UInt64_eq_mask(uVar8,5);
      uVar4 = ~uVar3;
      auVar32._8_4_ = (int)uVar3;
      auVar32._0_8_ = uVar3;
      auVar32._12_4_ = (int)(uVar3 >> 0x20);
      auVar62._8_4_ = (int)uVar4;
      auVar62._0_8_ = uVar4;
      auVar62._12_4_ = (int)(uVar4 >> 0x20);
      lVar2 = 0;
      do {
        *(undefined1 (*) [16])(local_3638 + lVar2) =
             *(undefined1 (*) [16])(local_3638 + lVar2) & auVar62 |
             *(undefined1 (*) [16])(local_1838 + lVar2) & auVar32;
        lVar2 = lVar2 + 2;
      } while (lVar2 != 0x40);
      uVar3 = FStar_UInt64_eq_mask(uVar8,6);
      uVar4 = ~uVar3;
      auVar33._8_4_ = (int)uVar3;
      auVar33._0_8_ = uVar3;
      auVar33._12_4_ = (int)(uVar3 >> 0x20);
      auVar63._8_4_ = (int)uVar4;
      auVar63._0_8_ = uVar4;
      auVar63._12_4_ = (int)(uVar4 >> 0x20);
      lVar2 = 0;
      do {
        *(undefined1 (*) [16])(local_3638 + lVar2) =
             *(undefined1 (*) [16])(local_3638 + lVar2) & auVar63 |
             *(undefined1 (*) [16])(local_1638 + lVar2) & auVar33;
        lVar2 = lVar2 + 2;
      } while (lVar2 != 0x40);
      uVar3 = FStar_UInt64_eq_mask(uVar8,7);
      uVar4 = ~uVar3;
      auVar34._8_4_ = (int)uVar3;
      auVar34._0_8_ = uVar3;
      auVar34._12_4_ = (int)(uVar3 >> 0x20);
      auVar64._8_4_ = (int)uVar4;
      auVar64._0_8_ = uVar4;
      auVar64._12_4_ = (int)(uVar4 >> 0x20);
      lVar2 = 0;
      do {
        *(undefined1 (*) [16])(local_3638 + lVar2) =
             *(undefined1 (*) [16])(local_3638 + lVar2) & auVar64 |
             *(undefined1 (*) [16])(local_1438 + lVar2) & auVar34;
        lVar2 = lVar2 + 2;
      } while (lVar2 != 0x40);
      uVar3 = FStar_UInt64_eq_mask(uVar8,8);
      uVar4 = ~uVar3;
      auVar35._8_4_ = (int)uVar3;
      auVar35._0_8_ = uVar3;
      auVar35._12_4_ = (int)(uVar3 >> 0x20);
      auVar65._8_4_ = (int)uVar4;
      auVar65._0_8_ = uVar4;
      auVar65._12_4_ = (int)(uVar4 >> 0x20);
      lVar2 = 0;
      do {
        *(undefined1 (*) [16])(local_3638 + lVar2) =
             *(undefined1 (*) [16])(local_3638 + lVar2) & auVar65 |
             *(undefined1 (*) [16])(local_1238 + lVar2) & auVar35;
        lVar2 = lVar2 + 2;
      } while (lVar2 != 0x40);
      uVar3 = FStar_UInt64_eq_mask(uVar8,9);
      uVar4 = ~uVar3;
      auVar36._8_4_ = (int)uVar3;
      auVar36._0_8_ = uVar3;
      auVar36._12_4_ = (int)(uVar3 >> 0x20);
      auVar66._8_4_ = (int)uVar4;
      auVar66._0_8_ = uVar4;
      auVar66._12_4_ = (int)(uVar4 >> 0x20);
      lVar2 = 0;
      do {
        *(undefined1 (*) [16])(local_3638 + lVar2) =
             *(undefined1 (*) [16])(local_3638 + lVar2) & auVar66 |
             *(undefined1 (*) [16])(local_1038 + lVar2 * 8) & auVar36;
        lVar2 = lVar2 + 2;
      } while (lVar2 != 0x40);
      uVar3 = FStar_UInt64_eq_mask(uVar8,10);
      uVar4 = ~uVar3;
      auVar37._8_4_ = (int)uVar3;
      auVar37._0_8_ = uVar3;
      auVar37._12_4_ = (int)(uVar3 >> 0x20);
      auVar67._8_4_ = (int)uVar4;
      auVar67._0_8_ = uVar4;
      auVar67._12_4_ = (int)(uVar4 >> 0x20);
      lVar2 = 0;
      do {
        *(undefined1 (*) [16])(local_3638 + lVar2) =
             *(undefined1 (*) [16])(local_3638 + lVar2) & auVar67 |
             *(undefined1 (*) [16])(local_e38 + lVar2) & auVar37;
        lVar2 = lVar2 + 2;
      } while (lVar2 != 0x40);
      uVar3 = FStar_UInt64_eq_mask(uVar8,0xb);
      uVar4 = ~uVar3;
      auVar38._8_4_ = (int)uVar3;
      auVar38._0_8_ = uVar3;
      auVar38._12_4_ = (int)(uVar3 >> 0x20);
      auVar68._8_4_ = (int)uVar4;
      auVar68._0_8_ = uVar4;
      auVar68._12_4_ = (int)(uVar4 >> 0x20);
      lVar2 = 0;
      do {
        *(undefined1 (*) [16])(local_3638 + lVar2) =
             *(undefined1 (*) [16])(local_3638 + lVar2) & auVar68 |
             *(undefined1 (*) [16])(local_c38 + lVar2 * 8) & auVar38;
        lVar2 = lVar2 + 2;
      } while (lVar2 != 0x40);
      uVar3 = FStar_UInt64_eq_mask(uVar8,0xc);
      uVar4 = ~uVar3;
      auVar39._8_4_ = (int)uVar3;
      auVar39._0_8_ = uVar3;
      auVar39._12_4_ = (int)(uVar3 >> 0x20);
      auVar69._8_4_ = (int)uVar4;
      auVar69._0_8_ = uVar4;
      auVar69._12_4_ = (int)(uVar4 >> 0x20);
      lVar2 = 0;
      do {
        *(undefined1 (*) [16])(local_3638 + lVar2) =
             *(undefined1 (*) [16])(local_3638 + lVar2) & auVar69 |
             *(undefined1 (*) [16])(local_a38 + lVar2) & auVar39;
        lVar2 = lVar2 + 2;
      } while (lVar2 != 0x40);
      uVar3 = FStar_UInt64_eq_mask(uVar8,0xd);
      uVar4 = ~uVar3;
      auVar40._8_4_ = (int)uVar3;
      auVar40._0_8_ = uVar3;
      auVar40._12_4_ = (int)(uVar3 >> 0x20);
      auVar70._8_4_ = (int)uVar4;
      auVar70._0_8_ = uVar4;
      auVar70._12_4_ = (int)(uVar4 >> 0x20);
      lVar2 = 0;
      do {
        *(undefined1 (*) [16])(local_3638 + lVar2) =
             *(undefined1 (*) [16])(local_3638 + lVar2) & auVar70 |
             *(undefined1 (*) [16])(local_838 + lVar2 * 8) & auVar40;
        lVar2 = lVar2 + 2;
      } while (lVar2 != 0x40);
      uVar3 = FStar_UInt64_eq_mask(uVar8,0xe);
      uVar4 = ~uVar3;
      auVar41._8_4_ = (int)uVar3;
      auVar41._0_8_ = uVar3;
      auVar41._12_4_ = (int)(uVar3 >> 0x20);
      auVar71._8_4_ = (int)uVar4;
      auVar71._0_8_ = uVar4;
      auVar71._12_4_ = (int)(uVar4 >> 0x20);
      lVar2 = 0;
      do {
        *(undefined1 (*) [16])(local_3638 + lVar2) =
             *(undefined1 (*) [16])(local_3638 + lVar2) & auVar71 |
             *(undefined1 (*) [16])(local_638 + lVar2) & auVar41;
        lVar2 = lVar2 + 2;
      } while (lVar2 != 0x40);
      uVar3 = FStar_UInt64_eq_mask(uVar8,0xf);
      uVar4 = ~uVar3;
      auVar42._8_4_ = (int)uVar3;
      auVar42._0_8_ = uVar3;
      auVar42._12_4_ = (int)(uVar3 >> 0x20);
      auVar72._8_4_ = (int)uVar4;
      auVar72._0_8_ = uVar4;
      auVar72._12_4_ = (int)(uVar4 >> 0x20);
      lVar2 = 0;
      do {
        *(undefined1 (*) [16])(local_3638 + lVar2) =
             *(undefined1 (*) [16])(local_3638 + lVar2) & auVar72 |
             *(undefined1 (*) [16])(local_438 + lVar2 * 8) & auVar42;
        lVar2 = lVar2 + 2;
      } while (lVar2 != 0x40);
      memset(local_3238,0,0x400);
      memset(local_2a38,0,0x800);
      Hacl_Bignum_Karatsuba_bn_karatsuba_mul_uint64
                (0x40,local_3838,local_3638,local_2a38,local_3238);
      areduction(local_2e38,mu,local_3238,local_3838);
      iVar11 = iVar11 + 1;
    } while (iVar11 != (bBits >> 2) + (uint)(bBits == 0));
    memset(local_2838,0,0x200);
    c_00 = local_2a38;
    memcpy(c_00,local_3838,0x200);
  }
  reduction(n,mu,c_00,res);
  return;
}

Assistant:

static inline void
exp_consttime_precomp(
  uint32_t *n,
  uint32_t mu,
  uint32_t *r2,
  uint32_t *a,
  uint32_t bBits,
  uint32_t *b,
  uint32_t *res
)
{
  if (bBits < 200U)
  {
    uint32_t aM[8U] = { 0U };
    to(n, mu, r2, a, aM);
    uint32_t resM[8U] = { 0U };
    uint32_t ctx[16U] = { 0U };
    memcpy(ctx, n, 8U * sizeof (uint32_t));
    memcpy(ctx + 8U, r2, 8U * sizeof (uint32_t));
    uint32_t sw = 0U;
    uint32_t *ctx_n = ctx;
    uint32_t *ctx_r2 = ctx + 8U;
    from(ctx_n, mu, ctx_r2, resM);
    for (uint32_t i0 = 0U; i0 < bBits; i0++)
    {
      uint32_t i1 = (bBits - i0 - 1U) / 32U;
      uint32_t j = (bBits - i0 - 1U) % 32U;
      uint32_t tmp = b[i1];
      uint32_t bit = tmp >> j & 1U;
      uint32_t sw1 = bit ^ sw;
      KRML_MAYBE_FOR8(i,
        0U,
        8U,
        1U,
        uint32_t dummy = (0U - sw1) & (resM[i] ^ aM[i]);
        resM[i] = resM[i] ^ dummy;
        aM[i] = aM[i] ^ dummy;);
      uint32_t *ctx_n0 = ctx;
      amont_mul(ctx_n0, mu, aM, resM, aM);
      uint32_t *ctx_n1 = ctx;
      amont_sqr(ctx_n1, mu, resM, resM);
      sw = bit;
    }
    uint32_t sw0 = sw;
    KRML_MAYBE_FOR8(i,
      0U,
      8U,
      1U,
      uint32_t dummy = (0U - sw0) & (resM[i] ^ aM[i]);
      resM[i] = resM[i] ^ dummy;
      aM[i] = aM[i] ^ dummy;);
    from(n, mu, resM, res);
    return;
  }
  uint32_t aM[8U] = { 0U };
  to(n, mu, r2, a, aM);
  uint32_t resM[8U] = { 0U };
  uint32_t bLen;
  if (bBits == 0U)
  {
    bLen = 1U;
  }
  else
  {
    bLen = (bBits - 1U) / 32U + 1U;
  }
  uint32_t ctx[16U] = { 0U };
  memcpy(ctx, n, 8U * sizeof (uint32_t));
  memcpy(ctx + 8U, r2, 8U * sizeof (uint32_t));
  uint32_t table[128U] = { 0U };
  uint32_t tmp[8U] = { 0U };
  uint32_t *t0 = table;
  uint32_t *t1 = table + 8U;
  uint32_t *ctx_n0 = ctx;
  uint32_t *ctx_r20 = ctx + 8U;
  from(ctx_n0, mu, ctx_r20, t0);
  memcpy(t1, aM, 8U * sizeof (uint32_t));
  KRML_MAYBE_FOR7(i,
    0U,
    7U,
    1U,
    uint32_t *t11 = table + (i + 1U) * 8U;
    uint32_t *ctx_n1 = ctx;
    amont_sqr(ctx_n1, mu, t11, tmp);
    memcpy(table + (2U * i + 2U) * 8U, tmp, 8U * sizeof (uint32_t));
    uint32_t *t2 = table + (2U * i + 2U) * 8U;
    uint32_t *ctx_n = ctx;
    amont_mul(ctx_n, mu, aM, t2, tmp);
    memcpy(table + (2U * i + 3U) * 8U, tmp, 8U * sizeof (uint32_t)););
  if (bBits % 4U != 0U)
  {
    uint32_t i0 = bBits / 4U * 4U;
    uint32_t bits_c = Hacl_Bignum_Lib_bn_get_bits_u32(bLen, b, i0, 4U);
    memcpy(resM, (uint32_t *)table, 8U * sizeof (uint32_t));
    KRML_MAYBE_FOR15(i1,
      0U,
      15U,
      1U,
      uint32_t c = FStar_UInt32_eq_mask(bits_c, i1 + 1U);
      const uint32_t *res_j = table + (i1 + 1U) * 8U;
      KRML_MAYBE_FOR8(i,
        0U,
        8U,
        1U,
        uint32_t *os = resM;
        uint32_t x = (c & res_j[i]) | (~c & resM[i]);
        os[i] = x;););
  }
  else
  {
    uint32_t *ctx_n = ctx;
    uint32_t *ctx_r2 = ctx + 8U;
    from(ctx_n, mu, ctx_r2, resM);
  }
  uint32_t tmp0[8U] = { 0U };
  for (uint32_t i0 = 0U; i0 < bBits / 4U; i0++)
  {
    KRML_MAYBE_FOR4(i,
      0U,
      4U,
      1U,
      uint32_t *ctx_n = ctx;
      amont_sqr(ctx_n, mu, resM, resM););
    uint32_t k = bBits - bBits % 4U - 4U * i0 - 4U;
    uint32_t bits_l = Hacl_Bignum_Lib_bn_get_bits_u32(bLen, b, k, 4U);
    memcpy(tmp0, (uint32_t *)table, 8U * sizeof (uint32_t));
    KRML_MAYBE_FOR15(i1,
      0U,
      15U,
      1U,
      uint32_t c = FStar_UInt32_eq_mask(bits_l, i1 + 1U);
      const uint32_t *res_j = table + (i1 + 1U) * 8U;
      KRML_MAYBE_FOR8(i,
        0U,
        8U,
        1U,
        uint32_t *os = tmp0;
        uint32_t x = (c & res_j[i]) | (~c & tmp0[i]);
        os[i] = x;););
    uint32_t *ctx_n = ctx;
    amont_mul(ctx_n, mu, resM, tmp0, resM);
  }
  from(n, mu, resM, res);
}